

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

MemoryRegionSection *
memory_region_find_riscv32
          (MemoryRegionSection *__return_storage_ptr__,MemoryRegion_conflict *mr,hwaddr addr,
          uint64_t size)

{
  Int128 *pIVar1;
  ulong uVar2;
  MemoryRegion_conflict *pMVar3;
  _Bool _Var4;
  AddressSpace *pAVar5;
  FlatRange *pFVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  MemoryRegion_conflict *pMVar11;
  ulong uVar12;
  MemoryRegion *pMVar13;
  ulong uVar14;
  FlatView *pFVar15;
  hwaddr hVar16;
  ulong uVar17;
  ulong local_48 [2];
  uint64_t local_38;
  undefined8 local_30;
  
  uVar17 = addr + mr->addr;
  pMVar11 = mr->container;
  while (pMVar3 = pMVar11, pMVar3 != (MemoryRegion_conflict *)0x0) {
    uVar17 = uVar17 + pMVar3->addr;
    mr = pMVar3;
    pMVar11 = pMVar3->container;
  }
  do {
    pMVar11 = mr;
    mr = pMVar11->container;
  } while (pMVar11->container != (MemoryRegion_conflict *)0x0);
  for (pAVar5 = (pMVar11->uc->address_spaces).tqh_first; pAVar5 != (AddressSpace *)0x0;
      pAVar5 = (pAVar5->address_spaces_link).tqe_next) {
    if (pMVar11 == pAVar5->root) goto LAB_00bff1bd;
  }
  pAVar5 = (AddressSpace *)0x0;
LAB_00bff1bd:
  if (pAVar5 != (AddressSpace *)0x0) {
    pFVar15 = pAVar5->current_map;
    local_48[1] = 0;
    local_30 = 0;
    local_48[0] = uVar17;
    local_38 = size;
    pFVar6 = (FlatRange *)
             bsearch(local_48,pFVar15->ranges,(ulong)pFVar15->nr,0x40,cmp_flatrange_addr);
    if (pFVar6 != (FlatRange *)0x0) {
      if (pFVar15->ranges < pFVar6) {
        do {
          uVar2 = (ulong)pFVar6[-1].addr.start;
          lVar8 = *(long *)((long)&pFVar6[-1].addr.start + 8);
          if (((-lVar8 < (long)(ulong)(uVar17 < uVar2)) ||
              (uVar12 = (ulong)pFVar6[-1].addr.size,
              (long)(ulong)(uVar17 < uVar12 + uVar2) <=
              (long)-(*(long *)((long)&pFVar6[-1].addr.size + 8) + lVar8 +
                     (ulong)CARRY8(uVar12,uVar2)))) &&
             ((lVar8 < (long)(ulong)(uVar2 < uVar17) ||
              (uVar2 = (ulong)(uVar2 < uVar17 + size), lVar10 = lVar8 - (ulong)CARRY8(uVar17,size),
              (SBORROW8(lVar8,(ulong)CARRY8(uVar17,size)) != SBORROW8(lVar10,uVar2)) ==
              (long)(lVar10 - uVar2) < 0)))) break;
          pFVar6 = pFVar6 + -1;
        } while (pFVar15->ranges < pFVar6);
      }
      uVar2 = (ulong)(pFVar6->addr).start;
      lVar8 = *(long *)((long)&(pFVar6->addr).start + 8);
      uVar12 = uVar2;
      lVar10 = lVar8;
      if (lVar8 < (long)(ulong)(uVar2 < uVar17)) {
        uVar12 = uVar17;
        lVar10 = 0;
      }
      if ((lVar10 - (ulong)(uVar12 < uVar2) != lVar8) || (0 < lVar8)) {
        __assert_fail("r == a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                      ,0x16,"uint64_t int128_get64(Int128)");
      }
      hVar16 = (uVar12 - uVar2) + pFVar6->offset_in_region;
      uVar14 = (ulong)CARRY8(uVar17,size);
      pIVar1 = &(pFVar6->addr).size;
      uVar7 = uVar2 + (long)*pIVar1;
      pMVar13 = pFVar6->mr;
      uVar9 = lVar8 + *(long *)((long)&(pFVar6->addr).size + 8) +
              (ulong)CARRY8(uVar2,(ulong)*pIVar1);
      uVar2 = (ulong)(uVar17 + size < uVar7);
      if ((SBORROW8(uVar14,uVar9) != SBORROW8(uVar14 - uVar9,uVar2)) !=
          (long)((uVar14 - uVar9) - uVar2) < 0) {
        uVar7 = uVar17 + size;
        uVar9 = uVar14;
      }
      lVar8 = uVar7 - uVar12;
      lVar10 = uVar9 - (uVar7 < uVar12);
      _Var4 = pFVar6->readonly;
      goto LAB_00bff2f3;
    }
  }
  hVar16 = 0;
  pFVar15 = (FlatView *)0x0;
  pMVar13 = (MemoryRegion *)0x0;
  lVar10 = 0;
  lVar8 = 0;
  uVar12 = 0;
  _Var4 = false;
LAB_00bff2f3:
  *(long *)&__return_storage_ptr__->size = lVar8;
  *(long *)((long)&__return_storage_ptr__->size + 8) = lVar10;
  __return_storage_ptr__->mr = pMVar13;
  __return_storage_ptr__->fv = pFVar15;
  __return_storage_ptr__->offset_within_region = hVar16;
  __return_storage_ptr__->offset_within_address_space = uVar12;
  __return_storage_ptr__->readonly = _Var4;
  *(undefined8 *)&__return_storage_ptr__->field_0x31 = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x38 = 0;
  return __return_storage_ptr__;
}

Assistant:

MemoryRegionSection memory_region_find(MemoryRegion *mr,
                                       hwaddr addr, uint64_t size)
{
    MemoryRegionSection ret;

    ret = memory_region_find_rcu(mr, addr, size);
    return ret;
}